

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_face_load_sbit_image
                   (TT_Face face,FT_ULong strike_index,FT_UInt glyph_index,FT_UInt load_flags,
                   FT_Stream stream,FT_Bitmap *map,TT_SBit_MetricsRec *metrics)

{
  FT_UInt *pFVar1;
  FT_Stream stream_00;
  FT_Byte *pFVar2;
  FT_Library library;
  FT_UInt16 FVar3;
  FT_Error FVar4;
  FT_UInt32 FVar5;
  FT_UInt32 FVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  FT_Bitmap new_map;
  
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    if (face->ebdt_size == 0) {
      FVar4 = 0x8e;
    }
    else {
      stream_00 = (face->root).stream;
      uVar10 = face->sbit_strike_map[strike_index];
      FVar4 = FT_Stream_Seek(stream_00,face->ebdt_start);
      if (FVar4 == 0) {
        new_map.buffer = (uchar *)&((face->root).glyph)->bitmap;
        new_map._24_8_ = metrics;
        new_map.palette._0_2_ = 0;
        pFVar2 = face->sbit_table;
        uVar8 = face->sbit_table_size;
        lVar7 = (ulong)uVar10 * 0x30;
        FVar4 = 3;
        if (lVar7 + 0x37U <= uVar8) {
          uVar10 = *(uint *)(pFVar2 + lVar7 + 8);
          uVar9 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
          uVar10 = *(uint *)(pFVar2 + lVar7 + 0x10);
          new_map.palette._2_1_ = pFVar2[lVar7 + 0x36];
          if (((uVar9 <= uVar8) &&
              ((ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                      uVar10 << 0x18) <= uVar8 - uVar9 >> 3)) &&
             (new_map._0_8_ = face, new_map._8_8_ = stream_00,
             FVar4 = tt_sbit_decoder_load_image
                               ((TT_SBitDecoder)&new_map,glyph_index,0,0,0,
                                (byte)(load_flags >> 0x16) & 1), FVar4 == 0)) {
            if ((load_flags & 0x500000) == 0) {
              FVar4 = 0;
              if (map->pixel_mode == '\a') {
                library = ((face->root).glyph)->library;
                FT_Bitmap_Init(&new_map);
                FVar4 = FT_Bitmap_Convert(library,map,&new_map,1);
                if (FVar4 == 0) {
                  map->pixel_mode = new_map.pixel_mode;
                  map->pitch = new_map.pitch;
                  map->num_grays = new_map.num_grays;
                  ft_glyphslot_set_bitmap((face->root).glyph,new_map.buffer);
                  pFVar1 = &((face->root).glyph)->internal->flags;
                  *pFVar1 = *pFVar1 | 1;
                }
                else {
                  FT_Bitmap_Done(library,&new_map);
                }
              }
            }
            else {
              FVar4 = 0;
            }
          }
        }
      }
    }
  }
  else if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
    uVar10 = face->sbit_strike_map[strike_index];
    metrics->height = 0;
    metrics->width = 0;
    uVar10 = *(uint *)(face->sbit_table + (ulong)uVar10 * 4 + 8);
    uVar8 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18);
    iVar11 = 4;
    while (FVar4 = 6, glyph_index <= (uint)(face->root).num_glyphs) {
      if ((face->ebdt_size <= uVar8) || (face->ebdt_size - uVar8 < (ulong)(glyph_index * 4 + 0xc)))
      {
        return 3;
      }
      FVar4 = FT_Stream_Seek(stream,(ulong)(glyph_index << 2) + uVar8 + 4 + face->ebdt_start);
      if (FVar4 != 0) {
        return FVar4;
      }
      FVar4 = FT_Stream_EnterFrame(stream,8);
      if (FVar4 != 0) {
        return FVar4;
      }
      FVar5 = FT_Stream_GetULong(stream);
      FVar6 = FT_Stream_GetULong(stream);
      FT_Stream_ExitFrame(stream);
      uVar10 = FVar6 - FVar5;
      if (uVar10 == 0) {
        return 0x9d;
      }
      if (FVar6 < FVar5) {
        return 3;
      }
      if (uVar10 < 8) {
        return 3;
      }
      if (face->ebdt_size - uVar8 < (ulong)FVar6) {
        return 3;
      }
      FVar4 = FT_Stream_Seek(stream,FVar5 + uVar8 + face->ebdt_start);
      if (FVar4 != 0) {
        return FVar4;
      }
      FVar4 = FT_Stream_EnterFrame(stream,(ulong)uVar10);
      if (FVar4 != 0) {
        return FVar4;
      }
      FT_Stream_GetUShort(stream);
      FT_Stream_GetUShort(stream);
      FVar5 = FT_Stream_GetULong(stream);
      if (FVar5 != 0x64757065) {
        FVar4 = 7;
        if (((FVar5 == 0x6a706720) || (FVar5 == 0x7267626c)) || (FVar5 == 0x74696666)) {
          FVar4 = 2;
        }
LAB_00206bb5:
        FT_Stream_ExitFrame(stream);
        return FVar4;
      }
      bVar12 = iVar11 == 0;
      iVar11 = iVar11 + -1;
      if (bVar12) {
        FVar4 = 3;
        goto LAB_00206bb5;
      }
      FVar3 = FT_Stream_GetUShort(stream);
      FT_Stream_ExitFrame(stream);
      glyph_index = (FT_UInt)FVar3;
    }
  }
  else {
    FVar4 = 2;
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit_image( TT_Face              face,
                           FT_ULong             strike_index,
                           FT_UInt              glyph_index,
                           FT_UInt              load_flags,
                           FT_Stream            stream,
                           FT_Bitmap           *map,
                           TT_SBit_MetricsRec  *metrics )
  {
    FT_Error  error = FT_Err_Ok;


    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        TT_SBitDecoderRec  decoder[1];


        error = tt_sbit_decoder_init( decoder, face, strike_index, metrics );
        if ( !error )
        {
          error = tt_sbit_decoder_load_image(
                    decoder,
                    glyph_index,
                    0,
                    0,
                    0,
                    ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
          tt_sbit_decoder_done( decoder );
        }
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      error = tt_face_load_sbix_image(
                face,
                strike_index,
                glyph_index,
                stream,
                map,
                metrics,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      break;

    default:
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    /* Flatten color bitmaps if color was not requested. */
    if ( !error                                        &&
         !( load_flags & FT_LOAD_COLOR )               &&
         !( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) &&
         map->pixel_mode == FT_PIXEL_MODE_BGRA         )
    {
      FT_Bitmap   new_map;
      FT_Library  library = face->root.glyph->library;


      FT_Bitmap_Init( &new_map );

      /* Convert to 8bit grayscale. */
      error = FT_Bitmap_Convert( library, map, &new_map, 1 );
      if ( error )
        FT_Bitmap_Done( library, &new_map );
      else
      {
        map->pixel_mode = new_map.pixel_mode;
        map->pitch      = new_map.pitch;
        map->num_grays  = new_map.num_grays;

        ft_glyphslot_set_bitmap( face->root.glyph, new_map.buffer );
        face->root.glyph->internal->flags |= FT_GLYPH_OWN_BITMAP;
      }
    }

    return error;
  }